

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

void __thiscall Clasp::ClaspStatistics::Impl::~Impl(Impl *this)

{
  bool bVar1;
  reference ppcVar2;
  _Node_iterator_base<unsigned_long,_false> it_00;
  _Node_iterator_base<unsigned_long,_false> this_00;
  iterator end_1;
  iterator it_1;
  iterator end;
  iterator it;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffb8;
  _Node_iterator<const_char_*,_true,_true> *in_stack_ffffffffffffffc0;
  _Node_iterator_base<const_char_*,_true> local_18;
  _Node_iterator_base<const_char_*,_true> local_10 [2];
  
  local_10[0]._M_cur =
       (__node_type *)
       std::unordered_set<const_char_*,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<const_char_*>_>
       ::begin((unordered_set<const_char_*,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<const_char_*>_>
                *)in_stack_ffffffffffffffb8);
  local_18._M_cur =
       (__node_type *)
       std::unordered_set<const_char_*,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<const_char_*>_>
       ::end((unordered_set<const_char_*,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<const_char_*>_>
              *)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::__detail::operator!=(local_10,&local_18);
    if (!bVar1) break;
    ppcVar2 = std::__detail::_Node_iterator<const_char_*,_true,_true>::operator*
                        ((_Node_iterator<const_char_*,_true,_true> *)0x2081b3);
    in_stack_ffffffffffffffc0 = (_Node_iterator<const_char_*,_true,_true> *)*ppcVar2;
    if (in_stack_ffffffffffffffc0 != (_Node_iterator<const_char_*,_true,_true> *)0x0) {
      operator_delete__(in_stack_ffffffffffffffc0);
    }
    std::__detail::_Node_iterator<const_char_*,_true,_true>::operator++(in_stack_ffffffffffffffc0);
  }
  it_00._M_cur = (__node_type *)
                 std::
                 unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::begin(in_stack_ffffffffffffffb8);
  this_00._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<unsigned_long,_false> *)&stack0xffffffffffffffe0,
                       (_Node_iterator_base<unsigned_long,_false> *)&stack0xffffffffffffffd8);
    if (!bVar1) break;
    destroyIfWritable((Impl *)this_00._M_cur,(iterator)it_00._M_cur);
    std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
              ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_ffffffffffffffc0);
  }
  std::unordered_set<const_char_*,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<const_char_*>_>::
  ~unordered_set((unordered_set<const_char_*,_Clasp::StrHash,_Clasp::StrEq,_std::allocator<const_char_*>_>
                  *)0x208243);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)0x20824d);
  return;
}

Assistant:

~Impl() {
		for (StringSet::iterator it = strings_.begin(), end = strings_.end(); it != end; ++it) {
			delete[] *it;
		}
		for (KeySet::iterator it = objects_.begin(), end = objects_.end(); it != end; ++it) {
			destroyIfWritable(it);
		}
	}